

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

type chaiscript::Boxed_Number::go<unsigned_char>(Opers t_oper,Boxed_Value *t_lhs)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar4;
  type tVar5;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Opers t_oper_00;
  element_type *t;
  Opers t_oper_01;
  
  t_oper_01 = (Opers)((ulong)in_RDX >> 0x20);
  t = in_RDI;
  if ((7 < in_ESI) && (in_ESI < 0xf)) {
    bVar1 = Boxed_Value::is_const((Boxed_Value *)0x25b567);
    if (!bVar1) {
      bVar1 = Boxed_Value::is_return_value((Boxed_Value *)0x25b575);
      if (!bVar1) {
        Boxed_Value::get_ptr((Boxed_Value *)0x25b58b);
        BVar4 = unary_go<unsigned_char>(t_oper_01,(uchar *)t,(Boxed_Value *)in_RDI);
        _Var3._M_pi = BVar4.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        goto LAB_0025b634;
      }
    }
  }
  t_oper_00 = (Opers)((ulong)in_RDI >> 0x20);
  if ((in_ESI < 0x17) || (0x1d < in_ESI)) {
    if (in_ESI < 0x1f) {
      uVar2 = __cxa_allocate_exception(0x28);
      chaiscript::detail::exception::bad_any_cast::bad_any_cast
                ((bad_any_cast *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      __cxa_throw(uVar2,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                  chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
    }
    Boxed_Value::get_const_ptr((Boxed_Value *)0x25b5f2);
    BVar4 = const_unary_go<unsigned_char>(t_oper_01,(uchar *)t);
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    Boxed_Value::get_const_ptr((Boxed_Value *)0x25b5c6);
    BVar4 = const_unary_int_go<unsigned_char>
                      (t_oper_00,(uchar *)CONCAT44(in_stack_ffffffffffffffd4,in_ESI));
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
LAB_0025b634:
  tVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  tVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = t;
  return (type)tVar5.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_lhs)
          -> typename std::enable_if<!std::is_floating_point<LHS>::value, Boxed_Value>::type
      {
        if (t_oper > Operators::non_const_flag && t_oper < Operators::non_const_int_flag && !t_lhs.is_const() && !t_lhs.is_return_value()) {
          return unary_go(t_oper, *static_cast<LHS *>(t_lhs.get_ptr()), t_lhs);
        } else if (t_oper > Operators::const_int_flag && t_oper < Operators::const_flag) {
          return const_unary_int_go(t_oper, *static_cast<const LHS *>(t_lhs.get_const_ptr()));
        } else if (t_oper > Operators::const_flag) {
          return const_unary_go(t_oper, *static_cast<const LHS *>(t_lhs.get_const_ptr()));
        } else {
          throw chaiscript::detail::exception::bad_any_cast();
        }
      }